

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O3

int Wln_ObjAlloc(Wln_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  uint Entry;
  Hash_IntMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  size_t __size;
  uint uVar3;
  Wln_Vec_t *pWVar4;
  int *piVar5;
  char *pcVar6;
  int *piVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar11;
  int iVar12;
  uint uVar13;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  Vec_Int_t *pVVar19;
  ulong uVar14;
  
  pVVar19 = &p->vTypes;
  Entry = (p->vTypes).nSize;
  if (Entry == (p->vTypes).nCap) {
    lVar18 = (long)(int)Entry;
    iVar12 = Entry * 2;
    if (p->vFanins == (Wln_Vec_t *)0x0) {
      pWVar4 = (Wln_Vec_t *)malloc(lVar18 << 5);
      uVar9 = Entry;
    }
    else {
      pWVar4 = (Wln_Vec_t *)realloc(p->vFanins,lVar18 << 5);
      uVar9 = pVVar19->nCap;
    }
    p->vFanins = pWVar4;
    memset(pWVar4 + lVar18,0,lVar18 * 0x10);
    if ((int)uVar9 < iVar12) {
      piVar5 = (p->vTypes).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar12 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)iVar12 << 2);
      }
      (p->vTypes).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_003876cd;
      pVVar19->nCap = iVar12;
    }
  }
  if (Entry != (p->vSigns).nSize) {
    __assert_fail("iObj == Vec_StrSize(&p->vSigns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                  ,0x72,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
  }
  if (Entry != (p->vRanges).nSize) {
    __assert_fail("iObj == Vec_IntSize(&p->vRanges)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                  ,0x73,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
  }
  Vec_IntPush(pVVar19,Type);
  uVar9 = (p->vSigns).nSize;
  if (uVar9 == (p->vSigns).nCap) {
    if ((int)uVar9 < 0x10) {
      pcVar6 = (p->vSigns).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,0x10);
      }
      (p->vSigns).pArray = pcVar6;
      (p->vSigns).nCap = 0x10;
    }
    else {
      __size = (ulong)uVar9 * 2;
      pcVar6 = (p->vSigns).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(__size);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,__size);
      }
      (p->vSigns).pArray = pcVar6;
      (p->vSigns).nCap = (int)__size;
    }
  }
  else {
    pcVar6 = (p->vSigns).pArray;
  }
  iVar12 = (p->vSigns).nSize;
  (p->vSigns).nSize = iVar12 + 1;
  pcVar6[iVar12] = (char)Signed;
  pHVar1 = p->pRanges;
  iVar12 = pHVar1->vObjs->nSize;
  iVar10 = iVar12 + 3;
  if (-1 < iVar12) {
    iVar10 = iVar12;
  }
  pVVar19 = pHVar1->vTable;
  uVar9 = iVar10 >> 2;
  if (pVVar19->nSize < (int)uVar9) {
    uVar16 = (ulong)(pVVar19->nSize * 2 - 1);
    while( true ) {
      do {
        uVar15 = (uint)uVar16;
        uVar13 = uVar15 + 1;
        uVar14 = (ulong)uVar13;
        uVar17 = uVar16 & 1;
        uVar16 = uVar14;
      } while (uVar17 != 0);
      if (uVar13 < 9) break;
      iVar10 = 5;
      while (uVar13 % (iVar10 - 2U) != 0) {
        uVar3 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar13 < uVar3) goto LAB_00387374;
      }
    }
LAB_00387374:
    if (pVVar19->nCap < (int)uVar13) {
      if (pVVar19->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar13 << 2);
      }
      else {
        piVar5 = (int *)realloc(pVVar19->pArray,(long)(int)uVar13 << 2);
      }
      pVVar19->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
LAB_003876cd:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar19->nCap = uVar13;
    }
    if (uVar15 < 0x7fffffff) {
      memset(pVVar19->pArray,0,uVar14 << 2);
    }
    pVVar19->nSize = uVar13;
    if (iVar12 < 8) {
      pVVar19 = pHVar1->vTable;
    }
    else {
      pVVar2 = pHVar1->vObjs;
      uVar16 = 2;
      if (2 < (int)uVar9) {
        uVar16 = (ulong)uVar9;
      }
      uVar17 = 1;
      do {
        uVar15 = pVVar2->nSize;
        if ((long)(int)uVar15 <= (long)(uVar17 * 4)) goto LAB_00387632;
        piVar5 = pVVar2->pArray;
        piVar5[uVar17 * 4 + 3] = 0;
        pVVar19 = pHVar1->vTable;
        uVar14 = (ulong)(uint)(piVar5[uVar17 * 4 + 1] * 0x1ec1 + piVar5[uVar17 * 4] * 0x1051) %
                 (ulong)(uint)pVVar19->nSize;
        if (((int)uVar14 < 0) || (pVVar19->nSize <= (int)uVar14)) goto LAB_00387632;
        iVar12 = pVVar19->pArray[uVar14];
        if (iVar12 == 0) {
          piVar7 = pVVar19->pArray + uVar14;
        }
        else {
          do {
            if ((iVar12 < 0) ||
               (uVar13 = iVar12 * 4,
               uVar15 == uVar13 || SBORROW4(uVar15,uVar13) != (int)(uVar15 + iVar12 * -4) < 0))
            goto LAB_00387632;
            piVar7 = piVar5 + uVar13;
            if ((*piVar7 == piVar5[uVar17 * 4]) && (piVar7[1] == piVar5[uVar17 * 4 + 1])) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHash.h"
                            ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
            }
            iVar12 = piVar7[3];
          } while (iVar12 != 0);
          piVar7 = piVar7 + 3;
        }
        *piVar7 = (int)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar16);
    }
  }
  uVar16 = (ulong)(uint)(Beg * 0x1ec1 + End * 0x1051) % (ulong)(uint)pVVar19->nSize;
  if ((-1 < (int)uVar16) && ((int)uVar16 < pVVar19->nSize)) {
    uVar15 = pVVar19->pArray[uVar16];
    pVVar2 = pHVar1->vObjs;
    if (uVar15 == 0) {
      puVar8 = (uint *)(pVVar19->pArray + uVar16);
    }
    else {
      do {
        if ((int)uVar15 < 0) goto LAB_00387632;
        uVar13 = uVar15 * 4;
        uVar3 = pVVar2->nSize;
        if (uVar3 == uVar13 || SBORROW4(uVar3,uVar13) != (int)(uVar3 + uVar15 * -4) < 0)
        goto LAB_00387632;
        piVar5 = pVVar2->pArray + uVar13;
        if ((*piVar5 == End) && (piVar5[1] == Beg)) goto LAB_00387558;
        uVar15 = piVar5[3];
      } while (uVar15 != 0);
      puVar8 = (uint *)(piVar5 + 3);
    }
    *puVar8 = uVar9;
    Vec_IntPush(pVVar2,End);
    Vec_IntPush(pHVar1->vObjs,Beg);
    Vec_IntPush(pHVar1->vObjs,0);
    Vec_IntPush(pHVar1->vObjs,0);
    uVar15 = uVar9;
LAB_00387558:
    Vec_IntPush(&p->vRanges,uVar15);
    if ((-1 < (int)Entry) && (iVar12 = (p->vTypes).nSize, (int)Entry < iVar12)) {
      if ((p->vTypes).pArray[Entry] == 3) {
        paVar11 = &p->vFanins[Entry].field_2;
        if (2 < p->vFanins[Entry].nSize) {
          paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar11->pArray[0];
        }
        paVar11->Array[1] = (p->vCis).nSize;
        Vec_IntPush(&p->vCis,Entry);
        iVar12 = (p->vTypes).nSize;
      }
      if ((int)Entry < iVar12) {
        if ((p->vTypes).pArray[Entry] == 4) {
          paVar11 = &p->vFanins[Entry].field_2;
          if (2 < p->vFanins[Entry].nSize) {
            paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar11->pArray[0];
          }
          paVar11->Array[1] = (p->vCos).nSize;
          Vec_IntPush(&p->vCos,Entry);
          iVar12 = (p->vTypes).nSize;
        }
        if ((int)Entry < iVar12) {
          if ((p->vTypes).pArray[Entry] == 0x59) {
            Vec_IntPush(&p->vFfs,Entry);
          }
          p->nObjs[Type] = p->nObjs[Type] + 1;
          return Entry;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_00387632:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

int Wln_ObjAlloc( Wln_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    int iObj = Vec_IntSize(&p->vTypes);
    if ( iObj == Vec_IntCap(&p->vTypes) )
    {
        p->vFanins = ABC_REALLOC( Wln_Vec_t, p->vFanins, 2 * iObj );
        memset( p->vFanins + iObj, 0, sizeof(Wln_Vec_t) * iObj );
        Vec_IntGrow( &p->vTypes, 2 * iObj );
    }
    assert( iObj == Vec_StrSize(&p->vSigns) );
    assert( iObj == Vec_IntSize(&p->vRanges) );
    Vec_IntPush( &p->vTypes, Type );
    Vec_StrPush( &p->vSigns, (char)Signed );
    Vec_IntPush( &p->vRanges, Hash_Int2ManInsert(p->pRanges, End, Beg, 0) );
    if ( Wln_ObjIsCi(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCis) ), Vec_IntPush( &p->vCis, iObj );
    if ( Wln_ObjIsCo(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCos) ), Vec_IntPush( &p->vCos, iObj );
    if ( Wln_ObjIsFf(p, iObj) ) Vec_IntPush( &p->vFfs, iObj );
    p->nObjs[Type]++;
    return iObj;
}